

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O2

void __thiscall
UnifiedRegex::
SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
::SyncToLiteralAndContinueInstT
          (SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
           *this,InstTag tag,CharCount offset,CharCount length)

{
  (this->super_Inst).tag = tag;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).
  super_LiteralMixin.offset = offset;
  (this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).
  super_LiteralMixin.length = length;
  TextbookBoyerMooreWithLinearMap<char16_t>::TextbookBoyerMooreWithLinearMap
            (&(this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>).
              scanner);
  return;
}

Assistant:

SyncToLiteralAndContinueInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}